

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

t_pvalue __thiscall xemmai::t_directory::f_read(t_directory *this,t_os *a_library)

{
  bool bVar1;
  directory_entry *pdVar2;
  t_type_of<xemmai::t_object> *a_type;
  path *this_00;
  t_object *ptVar3;
  perms *in_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar4;
  t_pvalue tVar5;
  wstring_view a_value;
  undefined1 local_d8 [56];
  path local_a0;
  wstring local_78;
  __sv_type local_58;
  t_object *local_48;
  t_object *local_40;
  t_object *p;
  file_status status;
  t_os *a_library_local;
  t_directory *this_local;
  
  t_owned::f_owned_or_throw((t_owned *)a_library);
  memset(&status,0,0x10);
  std::filesystem::__cxx11::directory_iterator::directory_iterator((directory_iterator *)&status);
  bVar1 = std::filesystem::__cxx11::operator==
                    ((directory_iterator *)&a_library->field_0x8,(directory_iterator *)&status);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&status);
  if (bVar1) {
    t_value<xemmai::t_pointer>::t_pointer((t_value<xemmai::t_pointer> *)this,(t_object *)0x0);
    aVar4 = extraout_RDX;
  }
  else {
    pdVar2 = std::filesystem::__cxx11::directory_iterator::operator->
                       ((directory_iterator *)&a_library->field_0x8);
    p = (t_object *)std::filesystem::__cxx11::directory_entry::status(pdVar2);
    a_type = t_slot_of::operator_cast_to_t_type_of_((t_slot_of *)(in_RDX + 0x10));
    pdVar2 = std::filesystem::__cxx11::directory_iterator::operator->
                       ((directory_iterator *)&a_library->field_0x8);
    this_00 = std::filesystem::__cxx11::directory_entry::path(pdVar2);
    std::filesystem::__cxx11::path::filename(&local_a0,this_00);
    std::filesystem::__cxx11::path::wstring(&local_78,&local_a0);
    local_58 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_78);
    a_value._M_str = local_58._M_str;
    a_value._M_len = (size_t)a_value._M_str;
    local_48 = t_string::f_instantiate((t_string *)local_58._M_len,a_value);
    local_d8[0x17] = std::filesystem::file_status::type((file_status *)&p);
    t_os::f_as<std::filesystem::file_type>((t_os *)(local_d8 + 0x18),(file_type *)in_RDX);
    std::filesystem::file_status::permissions((file_status *)&p);
    t_os::f_as<std::filesystem::perms>((t_os *)local_d8,in_RDX);
    ptVar3 = f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
                       (a_type,&local_48,(t_value<xemmai::t_pointer> *)(local_d8 + 0x18),
                        (t_value<xemmai::t_pointer> *)local_d8);
    std::__cxx11::wstring::~wstring((wstring *)&local_78);
    std::filesystem::__cxx11::path::~path(&local_a0);
    local_40 = ptVar3;
    std::filesystem::__cxx11::directory_iterator::operator++
              ((directory_iterator *)&a_library->field_0x8);
    t_value<xemmai::t_pointer>::t_pointer((t_value<xemmai::t_pointer> *)this,local_40);
    aVar4 = extraout_RDX_00;
  }
  tVar5.field_0.v_integer = aVar4.v_integer;
  tVar5.super_t_pointer.v_p = (t_object *)this;
  return tVar5;
}

Assistant:

t_pvalue t_directory::f_read(t_os* a_library)
{
	f_owned_or_throw();
	if (v_i == decltype(v_i){}) return nullptr;
	auto status = v_i->status();
	auto p = f_new_value(a_library->v_type_directory_entry, t_string::f_instantiate(v_i->path().filename().wstring()), a_library->f_as(status.type()), a_library->f_as(status.permissions()));
	++v_i;
	return p;
}